

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O0

void __thiscall
CTcGenTarg::build_local_symbol_records(CTcGenTarg *this,CTcCodeStream *cs,CVmHashTable *tab)

{
  uint uVar1;
  ulong uVar2;
  CVmHashEntry *pCVar3;
  CTcDataStream *this_00;
  CTcDataStream *in_RSI;
  CTcStreamAnchor *anchor_1;
  dbglcl *l;
  char nbuf [81];
  size_t nlen;
  ulong lofs;
  uint flags;
  uint i;
  uint fi;
  uint frame_cnt;
  ulong ofs;
  uint cnt;
  ulong dbg_ofs;
  ulong start_ofs;
  CTcStreamAnchor *anchor;
  uint in_stack_fffffffffffffeec;
  CTcDataStream **in_stack_fffffffffffffef0;
  CTcDataStream *in_stack_fffffffffffffef8;
  CTcDataStream *in_stack_ffffffffffffff00;
  CTcPrsMem *in_stack_ffffffffffffff08;
  CTcDataStream *in_stack_ffffffffffffff10;
  CTcDataStream local_b8;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  long local_40;
  uint local_34;
  ulong local_30;
  ulong local_28;
  CTcStreamAnchor *local_20;
  
  if (1 < G_sizes.dbg_fmt_vsn) {
    for (local_20 = CTcDataStream::get_first_anchor(in_RSI); local_20 != (CTcStreamAnchor *)0x0;
        local_20 = local_20->nxt_) {
      uVar2 = CTcStreamAnchor::get_ofs(local_20);
      local_28 = uVar2;
      uVar1 = CTcDataStream::readu2_at(in_stack_ffffffffffffff00,(ulong)in_stack_fffffffffffffef8);
      local_30 = uVar2 + uVar1;
      if (local_30 != local_28) {
        local_40 = local_30 + (long)G_sizes.dbg_hdr;
        local_34 = CTcDataStream::readu2_at
                             (in_stack_ffffffffffffff00,(ulong)in_stack_fffffffffffffef8);
        local_40 = (ulong)(local_34 * G_sizes.dbg_line) + local_40 + 4;
        local_44 = CTcDataStream::readu2_at
                             (in_stack_ffffffffffffff00,(ulong)in_stack_fffffffffffffef8);
        local_40 = (ulong)(local_44 << 1) + local_40 + 2;
        for (local_48 = 0; local_48 < local_44; local_48 = local_48 + 1) {
          local_34 = CTcDataStream::readu2_at
                               (in_stack_ffffffffffffff00,(ulong)in_stack_fffffffffffffef8);
          local_40 = G_sizes.dbg_frame + local_40;
          for (local_4c = 0; local_4c < local_34; local_4c = local_4c + 1) {
            local_50 = CTcDataStream::readu2_at
                                 (in_stack_ffffffffffffff00,(ulong)in_stack_fffffffffffffef8);
            local_40 = G_sizes.lcl_hdr + local_40;
            if ((local_50 & 4) == 0) {
              uVar1 = CTcDataStream::readu2_at
                                (in_stack_ffffffffffffff00,(ulong)in_stack_fffffffffffffef8);
              local_40 = (ulong)(uVar1 + 2) + local_40;
            }
            else {
              uVar1 = CTcDataStream::readu4_at
                                (in_stack_ffffffffffffff00,(ulong)in_stack_fffffffffffffef8);
              local_b8._96_8_ = ZEXT48(uVar1);
              uVar1 = CTcDataStream::readu2_at
                                (in_stack_ffffffffffffff00,(ulong)in_stack_fffffffffffffef8);
              local_b8.allocator_ = (CTcPrsMem *)(ulong)uVar1;
              if (local_b8.allocator_ < (CTcPrsMem *)0x51) {
                CTcDataStream::copy_to_buf
                          (in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08,
                           (ulong)in_stack_ffffffffffffff00,(ulong)in_stack_fffffffffffffef8);
                pCVar3 = CVmHashTable::find((CVmHashTable *)in_stack_ffffffffffffff08,
                                            (char *)in_stack_ffffffffffffff00,
                                            (size_t)in_stack_fffffffffffffef8);
                if (pCVar3 == (CVmHashEntry *)0x0) {
                  in_stack_fffffffffffffef0 = &G_ds;
                  this_00 = (CTcDataStream *)
                            CTcDataStream::add_anchor
                                      (in_stack_ffffffffffffff10,
                                       (CTcSymbol *)in_stack_ffffffffffffff08,
                                       (CTcAbsFixup **)in_stack_ffffffffffffff00);
                  in_stack_fffffffffffffef8 = (CTcDataStream *)operator_new(0x38);
                  in_stack_ffffffffffffff00 = &local_b8;
                  in_stack_ffffffffffffff08 = local_b8.allocator_;
                  CTcDataStream::get_ofs
                            ((CTcDataStream *)
                             ((CTcDataStream *)in_stack_fffffffffffffef0)->_vptr_CTcDataStream);
                  in_stack_ffffffffffffff10 = this_00;
                  dbglcl::dbglcl((dbglcl *)this_00,(char *)in_stack_ffffffffffffff08,
                                 (size_t)in_stack_ffffffffffffff00,
                                 (CTcStreamAnchor *)in_stack_fffffffffffffef8,
                                 (ulong)in_stack_fffffffffffffef0);
                  CVmHashTable::add((CVmHashTable *)in_stack_ffffffffffffff00,
                                    (CVmHashEntry *)in_stack_fffffffffffffef8);
                  CTcDataStream::write2
                            ((CTcDataStream *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
                  CTcDataStream::write(G_ds,(int)&local_b8,local_b8.allocator_,(size_t)this_00);
                }
                CTcAbsFixup::add_abs_fixup
                          ((CTcAbsFixup **)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                           (ulong)in_stack_fffffffffffffef0);
                CTcDataStream::write4_at
                          (in_stack_ffffffffffffff00,(ulong)in_stack_fffffffffffffef8,
                           (ulong)in_stack_fffffffffffffef0);
              }
              local_40 = local_40 + 4;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CTcGenTarg::build_local_symbol_records(CTcCodeStream *cs,
                                            CVmHashTable *tab)
{
    CTcStreamAnchor *anchor;

    /* this only applies for debug format 2+ */
    if (G_sizes.dbg_fmt_vsn < 2)
        return;

    /* go through the list of anchors in the code stream */
    for (anchor = cs->get_first_anchor() ; anchor != 0 ;
         anchor = anchor->nxt_)
    {
        ulong start_ofs;
        ulong dbg_ofs;
        uint cnt;
        ulong ofs;

        /* get the anchor's stream offset */
        start_ofs = anchor->get_ofs();

        /* read the debug table offset from the method header */
        dbg_ofs = start_ofs + cs->readu2_at(start_ofs + 8);

        /* if there's no debug table for this method, go on to the next */
        if (dbg_ofs == start_ofs)
            continue;

        /* read the number of line entries */
        ofs = dbg_ofs + G_sizes.dbg_hdr;
        cnt = cs->readu2_at(ofs);
        ofs += 2;

        /* skip past the line entries */
        ofs += cnt * G_sizes.dbg_line;

        /* skip the end offset */
        ofs += 2;

        /* read the frame count */
        uint frame_cnt = cs->readu2_at(ofs);
        ofs += 2;

        /* skip the frame index */
        ofs += 2 * frame_cnt;

        /* go through the individual frames */
        for (uint fi = 0 ; fi < frame_cnt ; ++fi)
        {
            /* get the number of entries */
            cnt = cs->readu2_at(ofs + 2);

            /* skip to the first entry */
            ofs += G_sizes.dbg_frame;

            /* parse each entry */
            for (uint i = 0 ; i < cnt ; ++i)
            {
                /* read the flags */
                uint flags = cs->readu2_at(ofs + 2);
                ofs += G_sizes.lcl_hdr;

                /* 
                 *   If this is an out-of-line entry, we currently have a
                 *   pointer to the local variable stream, and we need to
                 *   move it to the constant pool instead.  If it's in-line,
                 *   there's nothing to do - we just skip the record. 
                 */
                if (flags & 0x0004)
                {
                    /* 
                     *   It's a constant pool entry.  Read the name from the
                     *   local variable pool.  
                     */
                    ulong lofs = cs->readu4_at(ofs);
                    size_t nlen = G_lcl_stream->readu2_at(lofs);
                    if (nlen <= TOK_SYM_MAX_LEN)
                    {
                        /* read the name */
                        char nbuf[TOK_SYM_MAX_LEN + 1];
                        G_lcl_stream->copy_to_buf(nbuf, lofs + 2, nlen);

                        /* 
                         *   Look up the name in our symbol table, to see if
                         *   we've already defined it.  If so, re-use the
                         *   same name.  A few local variable names tend to
                         *   be used over and over, so it saves a lot of
                         *   space to share one copy for each instance of a
                         *   reused name. 
                         */
                        dbglcl *l = (dbglcl *)tab->find(nbuf, nlen);
                        if (l == 0)
                        {
                            /* add an anchor for the constant pool entry */
                            CTcStreamAnchor *anchor = G_ds->add_anchor(0, 0);

                            /* 
                             *   It's not already defined.  Add a new symbol
                             *   table entry for it.  The entry will go at
                             *   the current constant pool stream offset.  
                             */
                            l = new dbglcl(nbuf, nlen, anchor,
                                           G_ds->get_ofs());
                            tab->add(l);

                            /* copy the name to the constant pool stream */
                            G_ds->write2(nlen);
                            G_ds->write(nbuf, nlen);
                        }

                        /* add a fixup for this pointer in the code stream */
                        CTcAbsFixup::add_abs_fixup(
                            l->anchor->fixup_list_head_, cs, ofs);

                        /* 
                         *   Overwrite the local stream offset with the
                         *   constant pool offset of the symbol. 
                         */
                        cs->write4_at(ofs, l->ofs);
                    }

                    /* skip the record */
                    ofs += 4;
                }
                else
                {
                    /* it's in-line - just skip to the next record */
                    ofs += cs->readu2_at(ofs) + 2;
                }
            }
        }
    }
}